

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

void V_Init2(void)

{
  undefined4 uVar1;
  DFrameBuffer *pDVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  DFrameBuffer *s;
  uint local_10;
  float gamma;
  int height;
  int width;
  
  bVar3 = DObject::IsKindOf((DObject *)screen,DDummyFrameBuffer::RegistrationInfo.MyClass);
  if (!bVar3) {
    __assert_fail("screen->IsKindOf(RUNTIME_CLASS(DDummyFrameBuffer))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_video.cpp"
                  ,0x61c,"void V_Init2()");
  }
  gamma = (float)DCanvas::GetWidth((DCanvas *)screen);
  local_10 = DCanvas::GetHeight((DCanvas *)screen);
  pDVar2 = screen;
  uVar1 = *(undefined4 *)&screen[1].super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject;
  screen = (DFrameBuffer *)0x0;
  (pDVar2->super_DSimpleCanvas).super_DCanvas.super_DObject.ObjectFlags =
       (pDVar2->super_DSimpleCanvas).super_DCanvas.super_DObject.ObjectFlags | 0x80;
  if (pDVar2 != (DFrameBuffer *)0x0) {
    (*(pDVar2->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[2])();
  }
  I_InitGraphics();
  I_ClosestResolution((int *)&gamma,(int *)&local_10,8);
  uVar4 = (*Video->_vptr_IVideo[7])(Video,(ulong)(uint)gamma,(ulong)local_10,8);
  if ((uVar4 & 1) == 0) {
    I_FatalError("Could not set resolution to %d x %d x %d",(ulong)(uint)gamma,(ulong)local_10,8);
  }
  else {
    uVar4 = DCanvas::GetWidth((DCanvas *)screen);
    uVar5 = DCanvas::GetHeight((DCanvas *)screen);
    Printf("Resolution: %d x %d\n",(ulong)uVar4,(ulong)uVar5);
  }
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1d])(uVar1);
  (*Renderer->_vptr_FRenderer[5])();
  FBaseCVar::ResetColors();
  C_NewModeAdjust();
  M_InitVideoModesMenu();
  V_SetBorderNeedRefresh();
  setsizeneeded = true;
  return;
}

Assistant:

void V_Init2()
{
	assert (screen->IsKindOf(RUNTIME_CLASS(DDummyFrameBuffer)));
	int width = screen->GetWidth();
	int height = screen->GetHeight();
	float gamma = static_cast<DDummyFrameBuffer *>(screen)->Gamma;

	{
		DFrameBuffer *s = screen;
		screen = NULL;
		s->ObjectFlags |= OF_YesReallyDelete;
		delete s;
	}

	I_InitGraphics();
	I_ClosestResolution (&width, &height, 8);

	if (!Video->SetResolution (width, height, 8))
		I_FatalError ("Could not set resolution to %d x %d x %d", width, height, 8);
	else
		Printf ("Resolution: %d x %d\n", SCREENWIDTH, SCREENHEIGHT);

	screen->SetGamma (gamma);
	Renderer->RemapVoxels();
	FBaseCVar::ResetColors ();
	C_NewModeAdjust();
	M_InitVideoModesMenu();
	V_SetBorderNeedRefresh();
	setsizeneeded = true;
}